

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

long flatbuffers::JsonPrinter::GetFieldDefault<long>(FieldDef *fd)

{
  bool bVar1;
  long val;
  int64_t local_8;
  
  local_8 = 0;
  bVar1 = StringToNumber<long>((fd->value).constant._M_dataplus._M_p,&local_8);
  if (bVar1) {
    return local_8;
  }
  __assert_fail("check",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_text.cpp"
                ,0xfb,
                "static T flatbuffers::JsonPrinter::GetFieldDefault(const FieldDef &) [T = long]");
}

Assistant:

static T GetFieldDefault(const FieldDef &fd) {
    T val{};
    auto check = StringToNumber(fd.value.constant.c_str(), &val);
    (void)check;
    FLATBUFFERS_ASSERT(check);
    return val;
  }